

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_encoder.cc
# Opt level: O0

bool __thiscall
draco::AttributesEncoder::EncodeAttributesEncoderData
          (AttributesEncoder *this,EncoderBuffer *out_buffer)

{
  undefined1 uVar1;
  uint32_t uVar2;
  Type TVar3;
  DataType DVar4;
  PointAttribute *this_00;
  PointCloud *in_RSI;
  uchar *in_RDI;
  Type type;
  PointAttribute *pa;
  int32_t att_id;
  uint32_t i;
  undefined4 in_stack_ffffffffffffffa8;
  int32_t in_stack_ffffffffffffffac;
  PointCloud *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffd8;
  uint8_t in_stack_ffffffffffffffd9;
  undefined1 in_stack_ffffffffffffffda;
  uint local_14;
  
  num_attributes((AttributesEncoder *)0x2a4d5d);
  EncodeVarint<unsigned_int>
            ((uint)in_stack_ffffffffffffffb0,
             (EncoderBuffer *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  local_14 = 0;
  while( true ) {
    uVar2 = num_attributes((AttributesEncoder *)0x2a4d83);
    if (uVar2 <= local_14) break;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(ulong)local_14);
    this_00 = PointCloud::attribute(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    TVar3 = GeometryAttribute::attribute_type(&this_00->super_GeometryAttribute);
    uVar1 = (undefined1)TVar3;
    EncoderBuffer::Encode<unsigned_char>
              ((EncoderBuffer *)
               CONCAT44(TVar3,CONCAT13(uVar1,CONCAT12(in_stack_ffffffffffffffda,
                                                      CONCAT11(in_stack_ffffffffffffffd9,
                                                               in_stack_ffffffffffffffd8)))),in_RDI)
    ;
    in_stack_ffffffffffffffb0 = in_RSI;
    DVar4 = GeometryAttribute::data_type(&this_00->super_GeometryAttribute);
    in_stack_ffffffffffffffda = (undefined1)DVar4;
    EncoderBuffer::Encode<unsigned_char>
              ((EncoderBuffer *)
               CONCAT44(TVar3,CONCAT13(uVar1,CONCAT12(in_stack_ffffffffffffffda,
                                                      CONCAT11(in_stack_ffffffffffffffd9,
                                                               in_stack_ffffffffffffffd8)))),in_RDI)
    ;
    in_stack_ffffffffffffffd9 = GeometryAttribute::num_components(&this_00->super_GeometryAttribute)
    ;
    EncoderBuffer::Encode<unsigned_char>
              ((EncoderBuffer *)
               CONCAT44(TVar3,CONCAT13(uVar1,CONCAT12(in_stack_ffffffffffffffda,
                                                      CONCAT11(in_stack_ffffffffffffffd9,
                                                               in_stack_ffffffffffffffd8)))),in_RDI)
    ;
    in_stack_ffffffffffffffd8 = GeometryAttribute::normalized(&this_00->super_GeometryAttribute);
    EncoderBuffer::Encode<unsigned_char>
              ((EncoderBuffer *)
               CONCAT44(TVar3,CONCAT13(uVar1,CONCAT12(in_stack_ffffffffffffffda,
                                                      CONCAT11(in_stack_ffffffffffffffd9,
                                                               in_stack_ffffffffffffffd8)))),in_RDI)
    ;
    GeometryAttribute::unique_id(&this_00->super_GeometryAttribute);
    EncodeVarint<unsigned_int>
              ((uint)in_stack_ffffffffffffffb0,
               (EncoderBuffer *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    local_14 = local_14 + 1;
  }
  return true;
}

Assistant:

bool AttributesEncoder::EncodeAttributesEncoderData(EncoderBuffer *out_buffer) {
  // Encode data about all attributes.
  EncodeVarint(num_attributes(), out_buffer);
  for (uint32_t i = 0; i < num_attributes(); ++i) {
    const int32_t att_id = point_attribute_ids_[i];
    const PointAttribute *const pa = point_cloud_->attribute(att_id);
    GeometryAttribute::Type type = pa->attribute_type();
#ifdef DRACO_TRANSCODER_SUPPORTED
    // Attribute types TANGENT, MATERIAL, JOINTS, and WEIGHTS are not supported
    // in the official bitstream. They will be encoded as GENERIC.
    if (type > GeometryAttribute::GENERIC) {
      type = GeometryAttribute::GENERIC;
    }
#endif
    out_buffer->Encode(static_cast<uint8_t>(type));
    out_buffer->Encode(static_cast<uint8_t>(pa->data_type()));
    out_buffer->Encode(static_cast<uint8_t>(pa->num_components()));
    out_buffer->Encode(static_cast<uint8_t>(pa->normalized()));
    EncodeVarint(pa->unique_id(), out_buffer);
  }
  return true;
}